

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

uint16_t __thiscall World::first_empty_game_string_id(World *this,uint16_t initial_index)

{
  pointer pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  undefined6 in_register_00000032;
  
  uVar4 = CONCAT62(in_register_00000032,initial_index) & 0xffffffff;
  pbVar1 = (this->_game_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->_game_strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  for (plVar5 = (long *)((long)&pbVar1->_M_string_length +
                        (ulong)(uint)((int)CONCAT62(in_register_00000032,initial_index) << 5));
      (uVar3 = uVar2, uVar4 < uVar2 && (uVar3 = uVar4, *plVar5 != 0)); plVar5 = plVar5 + 4) {
    uVar4 = uVar4 + 1;
  }
  return (uint16_t)uVar3;
}

Assistant:

uint16_t World::first_empty_game_string_id(uint16_t initial_index) const
{
    for(size_t i=initial_index ; i<_game_strings.size() ; ++i)
        if(_game_strings[i].empty())
            return (uint16_t) i;
    return _game_strings.size();
}